

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,double kappa,double delta,double theta,double objective_amplifier)

{
  row_iterator prVar1;
  quadratic_cost_type<double> *this_00;
  int r_size_00;
  double dVar2;
  bool bVar3;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar4;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar5;
  type prVar6;
  pointer begin;
  pointer prVar7;
  type piVar8;
  type prVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool local_119;
  undefined1 auStack_c8 [7];
  bool pi_change;
  string_view local_b8;
  int local_a4;
  undefined1 auStack_a0 [4];
  int i_1;
  int local_8c;
  int local_88;
  int selected;
  int i;
  int r_size;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_64;
  undefined1 auStack_60 [4];
  int k;
  bool local_49;
  double dStack_48;
  bool at_least_one_pi_changed;
  double objective_amplifier_local;
  double theta_local;
  double delta_local;
  double kappa_local;
  bit_array *x_local;
  solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  *this_local;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  last_local;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  first_local;
  
  local_49 = false;
  dStack_48 = objective_amplifier;
  objective_amplifier_local = theta;
  theta_local = delta;
  delta_local = kappa;
  kappa_local = (double)x;
  x_local = (bit_array *)this;
  this_local = (solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                *)last._M_current;
  last_local = first;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
             "push-update-row {} {} {}\n");
  debug_logger<false>::log<double,double,double>
            ((debug_logger<false> *)this,_auStack_60,&delta_local,&theta_local,
             &objective_amplifier_local);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      (&last_local,
                       (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)&this_local);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    it.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (row_value *)last_local._M_current;
    local_64 = constraint<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                         (last_local);
    sparse_matrix<int>::row((sparse_matrix<int> *)&i,(int)this + 0x10);
    pprVar4 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar1 = *pprVar4;
    pprVar5 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
    ::decrease_preference
              ((solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                *)this,prVar1,*pprVar5,objective_amplifier_local);
    pprVar4 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar1 = *pprVar4;
    pprVar5 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    selected = solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                           *)this,prVar1,*pprVar5,(bit_array *)kappa_local);
    for (local_88 = 0; dVar2 = dStack_48, local_88 != selected; local_88 = local_88 + 1) {
      this_00 = *(quadratic_cost_type<double> **)(this + 0x70);
      prVar6 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_88);
      auVar10._0_8_ =
           quadratic_cost_type<double>::operator()(this_00,prVar6->id,(bit_array *)kappa_local);
      prVar6 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_88);
      auVar10._8_8_ = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar2;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = prVar6->value;
      auVar10 = vfmadd213sd_fma(auVar10,auVar11,auVar12);
      prVar6->value = auVar10._0_8_;
    }
    begin = std::
            unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                   *)(this + 0x58));
    prVar7 = std::
             unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                    *)(this + 0x58));
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*>
              (begin,prVar7 + selected,*(random_engine **)(this + 8));
    r_size_00 = selected;
    piVar8 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x60),
                        (long)local_64);
    local_8c = solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
               ::select_variables((solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                                   *)this,r_size_00,*piVar8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_a0,
               "constraints {}: {} = ");
    piVar8 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x60),
                        (long)local_64);
    debug_logger<false>::log<int,int>((debug_logger<false> *)this,_auStack_a0,&local_64,piVar8);
    for (local_a4 = 0; local_a4 < selected; local_a4 = local_a4 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"{} ({}) ")
      ;
      prVar6 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_a4);
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_a4);
      debug_logger<false>::log<double,int>
                ((debug_logger<false> *)this,local_b8,&prVar6->value,&prVar9->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8," => Selected: {}\n");
    debug_logger<false>::log<int>((debug_logger<false> *)this,_auStack_c8,&local_8c);
    dVar2 = kappa_local;
    pprVar4 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    bVar3 = affect<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                        *)this,(bit_array *)dVar2,*pprVar4,local_64,local_8c,selected,delta_local,
                       theta_local);
    local_119 = true;
    if ((local_49 & 1U) == 0) {
      local_119 = bVar3;
    }
    local_49 = local_119;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&last_local);
  }
  return (bool)(local_49 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }